

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::test_Capitalize::test_method(test_Capitalize *this)

{
  string str;
  string str_00;
  string str_01;
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  char *pcVar3;
  undefined8 in_stack_fffffffffffffe98;
  char *pcVar4;
  undefined8 in_stack_fffffffffffffea0;
  undefined1 *puVar5;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  allocator<char> local_109;
  char *local_108;
  char *local_100;
  undefined **local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x50f;
  file.m_begin = (iterator)&local_c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_01139f30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  std::__cxx11::string::string<std::allocator<char>>(local_78,"",&local_109);
  str._M_string_length = in_stack_fffffffffffffe90;
  str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe88;
  str.field_2._M_allocated_capacity = in_stack_fffffffffffffe98;
  str.field_2._8_8_ = in_stack_fffffffffffffea0;
  Capitalize(&local_58,str);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_f8,&local_108,0x50f,1,2,psVar2,"Capitalize(\"\")","","\"\"");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_78);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x510;
  file_00.m_begin = (iterator)&local_120;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_01139f30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  std::__cxx11::string::string<std::allocator<char>>(local_98,"bitcoin",&local_109);
  str_00._M_string_length = in_stack_fffffffffffffe90;
  str_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe88;
  str_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe98;
  str_00.field_2._8_8_ = in_stack_fffffffffffffea0;
  Capitalize(&local_58,str_00);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (&local_f8,&local_140,0x510,1,2,psVar2,"Capitalize(\"bitcoin\")","Bitcoin","\"Bitcoin\""
            );
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_98);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_148 = "";
  puVar5 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x511;
  file_01.m_begin = (iterator)&local_150;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
             (size_t)&stack0xfffffffffffffea0,msg_01);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_01139f30;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  pcVar4 = "";
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"",&local_109);
  str_01._M_string_length = (size_type)pcVar3;
  str_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe88;
  str_01.field_2._M_allocated_capacity = (size_type)pcVar4;
  str_01.field_2._8_8_ = puVar5;
  Capitalize(&local_58,str_01);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (&local_f8,&stack0xfffffffffffffe90,0x511,1,2,&local_58,
             "Capitalize(\"\\x00\\xfe\\xff\")","","\"\\x00\\xfe\\xff\"");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_Capitalize)
{
    BOOST_CHECK_EQUAL(Capitalize(""), "");
    BOOST_CHECK_EQUAL(Capitalize("bitcoin"), "Bitcoin");
    BOOST_CHECK_EQUAL(Capitalize("\x00\xfe\xff"), "\x00\xfe\xff");
}